

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

int create_swapchain(Init *init)

{
  bool bVar1;
  VkResult VVar2;
  SwapchainBuilder *this;
  ostream *poVar3;
  Swapchain *__src;
  error_code eVar4;
  error_code local_170;
  string local_160;
  undefined1 local_130 [8];
  Result<vkb::Swapchain> swap_ret;
  SwapchainBuilder swapchain_builder;
  Init *init_local;
  
  vkb::SwapchainBuilder::SwapchainBuilder((SwapchainBuilder *)&swap_ret.m_init,&init->device);
  this = vkb::SwapchainBuilder::set_old_swapchain
                   ((SwapchainBuilder *)&swap_ret.m_init,&init->swapchain);
  vkb::SwapchainBuilder::build((Result<vkb::Swapchain> *)local_130,this);
  bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_130);
  if (bVar1) {
    vkb::destroy_swapchain(&init->swapchain);
    __src = vkb::Result<vkb::Swapchain>::value((Result<vkb::Swapchain> *)local_130);
    memcpy(&init->swapchain,__src,0x60);
    init_local._4_4_ = 0;
  }
  else {
    eVar4 = vkb::Result<vkb::Swapchain>::error((Result<vkb::Swapchain> *)local_130);
    local_170._M_cat = eVar4._M_cat;
    local_170._M_value = eVar4._M_value;
    std::error_code::message_abi_cxx11_(&local_160,&local_170);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_160);
    poVar3 = std::operator<<(poVar3," ");
    VVar2 = vkb::Result<vkb::Swapchain>::vk_result((Result<vkb::Swapchain> *)local_130);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,VVar2);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_160);
    init_local._4_4_ = -1;
  }
  vkb::Result<vkb::Swapchain>::~Result((Result<vkb::Swapchain> *)local_130);
  vkb::SwapchainBuilder::~SwapchainBuilder((SwapchainBuilder *)&swap_ret.m_init);
  return init_local._4_4_;
}

Assistant:

int create_swapchain(Init& init) {

    vkb::SwapchainBuilder swapchain_builder{ init.device };
    auto swap_ret = swapchain_builder.set_old_swapchain(init.swapchain).build();
    if (!swap_ret) {
        std::cout << swap_ret.error().message() << " " << swap_ret.vk_result() << "\n";
        return -1;
    }
    vkb::destroy_swapchain(init.swapchain);
    init.swapchain = swap_ret.value();
    return 0;
}